

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NewFrame(void)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  ImGuiID IVar3;
  ImGuiWindow *this;
  bool bVar4;
  value_type *ppIVar5;
  ImGuiTextBuffer *pIVar6;
  value_type *ppIVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  bool local_12e;
  bool local_12d;
  byte local_12c;
  byte local_12b;
  byte local_12a;
  ImGuiWindow *local_128;
  ImGuiWindow *local_120;
  float local_110;
  float local_10c;
  float local_104;
  float local_100;
  bool local_fa;
  bool local_f9;
  ImVec2 local_dc;
  int local_d4;
  value_type pIStack_d0;
  int i_4;
  ImGuiWindow *window_2;
  int i_3;
  int scroll_lines;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 offset;
  float scale;
  float new_font_scale;
  ImGuiWindow *window_1;
  byte local_85;
  int local_84;
  bool mouse_avail_to_imgui;
  int i_2;
  bool mouse_any_down;
  ImGuiWindow *pIStack_78;
  int mouse_earliest_button_down;
  ImGuiWindow *window;
  ImGuiWindow *modal_window;
  ImVec2 local_60;
  int local_54;
  ImVec2 IStack_50;
  int i_1;
  ImVec2 local_48;
  int local_40;
  ImVec2 IStack_3c;
  int i;
  ImVec2 local_34;
  ImVec2 local_2c [3];
  ImGuiContext *local_10;
  ImGuiContext *g;
  
  local_10 = GImGui;
  if ((GImGui->IO).DeltaTime < 0.0) {
    __assert_fail("g.IO.DeltaTime >= 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x818,"void ImGui::NewFrame()");
  }
  bVar4 = false;
  if (0.0 <= (GImGui->IO).DisplaySize.x) {
    bVar4 = 0.0 <= (GImGui->IO).DisplaySize.y;
  }
  if (!bVar4) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x819,"void ImGui::NewFrame()");
  }
  if ((((GImGui->IO).Fonts)->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x81a,"void ImGui::NewFrame()");
  }
  ppIVar5 = ImVector<ImFont_*>::operator[](&((GImGui->IO).Fonts)->Fonts,0);
  bVar4 = ImFont::IsLoaded(*ppIVar5);
  if (!bVar4) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x81b,"void ImGui::NewFrame()");
  }
  if ((local_10->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x81c,"void ImGui::NewFrame()");
  }
  if ((local_10->Initialized & 1U) == 0) {
    pIVar6 = (ImGuiTextBuffer *)MemAlloc(0x10);
    local_10->LogClipboard = pIVar6;
    pIVar6 = (ImGuiTextBuffer *)operator_new(0x10);
    ImGuiTextBuffer::ImGuiTextBuffer(pIVar6);
    bVar4 = ImVector<ImGuiIniData>::empty(&local_10->Settings);
    if (!bVar4) {
      __assert_fail("g.Settings.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0x824,"void ImGui::NewFrame()");
    }
    LoadSettings();
    local_10->Initialized = true;
  }
  ppIVar5 = ImVector<ImFont_*>::operator[](&((local_10->IO).Fonts)->Fonts,0);
  SetCurrentFont(*ppIVar5);
  local_10->Time = (local_10->IO).DeltaTime + local_10->Time;
  local_10->FrameCount = local_10->FrameCount + 1;
  local_10->Tooltip[0] = '\0';
  ImDrawList::Clear(&local_10->OverlayDrawList);
  ImDrawList::PushTextureID(&local_10->OverlayDrawList,&((local_10->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(&local_10->OverlayDrawList);
  (local_10->RenderDrawData).Valid = false;
  (local_10->RenderDrawData).CmdLists = (ImDrawList **)0x0;
  (local_10->RenderDrawData).TotalIdxCount = 0;
  (local_10->RenderDrawData).TotalVtxCount = 0;
  (local_10->RenderDrawData).CmdListsCount = 0;
  pIVar1 = &(local_10->IO).MousePos;
  if ((pIVar1->x <= 0.0 && pIVar1->x != 0.0) &&
     (pfVar2 = &(local_10->IO).MousePos.y, *pfVar2 <= 0.0 && *pfVar2 != 0.0)) {
    ImVec2::ImVec2(local_2c,-9999.0,-9999.0);
    (local_10->IO).MousePos = local_2c[0];
  }
  pIVar1 = &(local_10->IO).MousePos;
  if (((pIVar1->x <= 0.0 && pIVar1->x != 0.0) &&
      (pfVar2 = &(local_10->IO).MousePos.y, *pfVar2 <= 0.0 && *pfVar2 != 0.0)) ||
     ((pIVar1 = &(local_10->IO).MousePosPrev, pIVar1->x <= 0.0 && pIVar1->x != 0.0 &&
      (pfVar2 = &(local_10->IO).MousePosPrev.y, *pfVar2 <= 0.0 && *pfVar2 != 0.0)))) {
    ImVec2::ImVec2(&local_34,0.0,0.0);
    (local_10->IO).MouseDelta = local_34;
  }
  else {
    IStack_3c = operator-(&(local_10->IO).MousePos,&(local_10->IO).MousePosPrev);
    (local_10->IO).MouseDelta = IStack_3c;
  }
  (local_10->IO).MousePosPrev = (local_10->IO).MousePos;
  for (local_40 = 0; local_40 < 5; local_40 = local_40 + 1) {
    local_f9 = false;
    if (((local_10->IO).MouseDown[local_40] & 1U) != 0) {
      pfVar2 = (local_10->IO).MouseDownDuration + local_40;
      local_f9 = *pfVar2 <= 0.0 && *pfVar2 != 0.0;
    }
    (local_10->IO).MouseClicked[local_40] = local_f9;
    local_fa = false;
    if (((local_10->IO).MouseDown[local_40] & 1U) == 0) {
      local_fa = 0.0 <= (local_10->IO).MouseDownDuration[local_40];
    }
    (local_10->IO).MouseReleased[local_40] = local_fa;
    (local_10->IO).MouseDownDurationPrev[local_40] = (local_10->IO).MouseDownDuration[local_40];
    if (((local_10->IO).MouseDown[local_40] & 1U) == 0) {
      local_104 = -1.0;
    }
    else {
      pfVar2 = (local_10->IO).MouseDownDuration + local_40;
      if (0.0 < *pfVar2 || *pfVar2 == 0.0) {
        local_100 = (local_10->IO).MouseDownDuration[local_40] + (local_10->IO).DeltaTime;
      }
      else {
        local_100 = 0.0;
      }
      local_104 = local_100;
    }
    (local_10->IO).MouseDownDuration[local_40] = local_104;
    (local_10->IO).MouseDoubleClicked[local_40] = false;
    if (((local_10->IO).MouseClicked[local_40] & 1U) == 0) {
      if (((local_10->IO).MouseDown[local_40] & 1U) != 0) {
        fVar8 = (local_10->IO).MouseDragMaxDistanceSqr[local_40];
        IStack_50 = operator-(&(local_10->IO).MousePos,(local_10->IO).MouseClickedPos + local_40);
        fVar9 = ImLengthSqr(&stack0xffffffffffffffb0);
        fVar8 = ImMax(fVar8,fVar9);
        (local_10->IO).MouseDragMaxDistanceSqr[local_40] = fVar8;
      }
    }
    else {
      if ((local_10->IO).MouseDoubleClickTime <=
          local_10->Time - (local_10->IO).MouseClickedTime[local_40]) {
        (local_10->IO).MouseClickedTime[local_40] = local_10->Time;
      }
      else {
        local_48 = operator-(&(local_10->IO).MousePos,(local_10->IO).MouseClickedPos + local_40);
        fVar8 = ImLengthSqr(&local_48);
        if (fVar8 < (local_10->IO).MouseDoubleClickMaxDist * (local_10->IO).MouseDoubleClickMaxDist)
        {
          (local_10->IO).MouseDoubleClicked[local_40] = true;
        }
        (local_10->IO).MouseClickedTime[local_40] = -3.4028235e+38;
      }
      (local_10->IO).MouseClickedPos[local_40] = (local_10->IO).MousePos;
      (local_10->IO).MouseDragMaxDistanceSqr[local_40] = 0.0;
    }
  }
  memcpy((local_10->IO).KeysDownDurationPrev,(local_10->IO).KeysDownDuration,0x800);
  for (local_54 = 0; local_54 < 0x200; local_54 = local_54 + 1) {
    if (((local_10->IO).KeysDown[local_54] & 1U) == 0) {
      local_110 = -1.0;
    }
    else {
      pfVar2 = (local_10->IO).KeysDownDuration + local_54;
      if (0.0 < *pfVar2 || *pfVar2 == 0.0) {
        local_10c = (local_10->IO).KeysDownDuration[local_54] + (local_10->IO).DeltaTime;
      }
      else {
        local_10c = 0.0;
      }
      local_110 = local_10c;
    }
    (local_10->IO).KeysDownDuration[local_54] = local_110;
  }
  local_10->FramerateSecPerFrameAccum =
       ((local_10->IO).DeltaTime - local_10->FramerateSecPerFrame[local_10->FramerateSecPerFrameIdx]
       ) + local_10->FramerateSecPerFrameAccum;
  local_10->FramerateSecPerFrame[local_10->FramerateSecPerFrameIdx] = (local_10->IO).DeltaTime;
  local_10->FramerateSecPerFrameIdx = (local_10->FramerateSecPerFrameIdx + 1) % 0x78;
  (local_10->IO).Framerate = 1.0 / (local_10->FramerateSecPerFrameAccum / 120.0);
  local_10->HoveredIdPreviousFrame = local_10->HoveredId;
  local_10->HoveredId = 0;
  local_10->HoveredIdAllowOverlap = false;
  if ((((local_10->ActiveIdIsAlive & 1U) == 0) &&
      (local_10->ActiveIdPreviousFrame == local_10->ActiveId)) && (local_10->ActiveId != 0)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
  }
  local_10->ActiveIdPreviousFrame = local_10->ActiveId;
  local_10->ActiveIdIsAlive = false;
  local_10->ActiveIdIsJustActivated = false;
  if ((local_10->MovedWindowMoveId == 0) || (local_10->MovedWindowMoveId != local_10->ActiveId)) {
    local_10->MovedWindow = (ImGuiWindow *)0x0;
    local_10->MovedWindowMoveId = 0;
  }
  else {
    KeepAliveID(local_10->MovedWindowMoveId);
    bVar4 = false;
    if (local_10->MovedWindow != (ImGuiWindow *)0x0) {
      bVar4 = local_10->MovedWindow->RootWindow != (ImGuiWindow *)0x0;
    }
    if (!bVar4) {
      __assert_fail("g.MovedWindow && g.MovedWindow->RootWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0x872,"void ImGui::NewFrame()");
    }
    if (local_10->MovedWindow->RootWindow->MoveId != local_10->MovedWindowMoveId) {
      __assert_fail("g.MovedWindow->RootWindow->MoveId == g.MovedWindowMoveId",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0x873,"void ImGui::NewFrame()");
    }
    if (((local_10->IO).MouseDown[0] & 1U) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      local_10->MovedWindow = (ImGuiWindow *)0x0;
      local_10->MovedWindowMoveId = 0;
    }
    else {
      if (((local_10->MovedWindow->Flags & 4U) == 0) &&
         (operator+=(&local_10->MovedWindow->PosFloat,&(local_10->IO).MouseDelta),
         (local_10->MovedWindow->Flags & 0x100U) == 0)) {
        MarkSettingsDirty();
      }
      FocusWindow(local_10->MovedWindow);
    }
  }
  if ((0.0 < local_10->SettingsDirtyTimer) &&
     (local_10->SettingsDirtyTimer = local_10->SettingsDirtyTimer - (local_10->IO).DeltaTime,
     local_10->SettingsDirtyTimer <= 0.0)) {
    SaveSettings();
  }
  if (local_10->MovedWindow == (ImGuiWindow *)0x0) {
    local_60 = (local_10->IO).MousePos;
    local_120 = FindHoveredWindow(local_60,false);
  }
  else {
    local_120 = local_10->MovedWindow;
  }
  local_10->HoveredWindow = local_120;
  if ((local_10->HoveredWindow == (ImGuiWindow *)0x0) ||
     ((local_10->HoveredWindow->Flags & 0x100000U) == 0)) {
    if (local_10->MovedWindow == (ImGuiWindow *)0x0) {
      modal_window = *(ImGuiWindow **)&(local_10->IO).MousePos;
      local_128 = FindHoveredWindow((ImVec2)modal_window,true);
    }
    else {
      local_128 = local_10->MovedWindow->RootWindow;
    }
    local_10->HoveredRootWindow = local_128;
  }
  else {
    local_10->HoveredRootWindow = local_10->HoveredWindow->RootWindow;
  }
  window = GetFrontMostModalRootWindow();
  if (window == (ImGuiWindow *)0x0) {
    local_10->ModalWindowDarkeningRatio = 0.0;
  }
  else {
    fVar8 = ImMin((local_10->IO).DeltaTime * 6.0 + local_10->ModalWindowDarkeningRatio,1.0);
    local_10->ModalWindowDarkeningRatio = fVar8;
    for (pIStack_78 = local_10->HoveredRootWindow;
        pIStack_78 != (ImGuiWindow *)0x0 && pIStack_78 != window;
        pIStack_78 = pIStack_78->ParentWindow) {
    }
    if (pIStack_78 == (ImGuiWindow *)0x0) {
      local_10->HoveredWindow = (ImGuiWindow *)0x0;
      local_10->HoveredRootWindow = (ImGuiWindow *)0x0;
    }
  }
  i_2 = -1;
  mouse_avail_to_imgui = false;
  for (local_84 = 0; local_84 < 5; local_84 = local_84 + 1) {
    if (((local_10->IO).MouseClicked[local_84] & 1U) != 0) {
      local_12a = 1;
      if (local_10->HoveredWindow == (ImGuiWindow *)0x0) {
        bVar4 = ImVector<ImGuiPopupRef>::empty(&local_10->OpenPopupStack);
        local_12a = bVar4 ^ 0xff;
      }
      (local_10->IO).MouseDownOwned[local_84] = (bool)(local_12a & 1);
    }
    mouse_avail_to_imgui =
         (mouse_avail_to_imgui & 1U) != 0 || ((local_10->IO).MouseDown[local_84] & 1U) != 0;
    if ((((local_10->IO).MouseDown[local_84] & 1U) != 0) &&
       ((i_2 == -1 ||
        (fVar8 = (local_10->IO).MouseClickedTime[i_2],
        pfVar2 = (local_10->IO).MouseClickedTime + local_84, *pfVar2 <= fVar8 && fVar8 != *pfVar2)))
       ) {
      i_2 = local_84;
    }
  }
  local_12b = 1;
  if (i_2 != -1) {
    local_12b = (local_10->IO).MouseDownOwned[i_2];
  }
  local_85 = local_12b & 1;
  if (local_10->CaptureMouseNextFrame == -1) {
    if (((local_85 == 0) ||
        ((local_12c = 1, local_10->HoveredWindow == (ImGuiWindow *)0x0 &&
         (local_12c = 1, mouse_avail_to_imgui == false)))) &&
       (local_12c = 1, local_10->ActiveId == 0)) {
      bVar4 = ImVector<ImGuiPopupRef>::empty(&local_10->OpenPopupStack);
      local_12c = bVar4 ^ 0xff;
    }
    (local_10->IO).WantCaptureMouse = (bool)(local_12c & 1);
  }
  else {
    (local_10->IO).WantCaptureMouse = local_10->CaptureMouseNextFrame != 0;
  }
  if (local_10->CaptureKeyboardNextFrame == -1) {
    IVar3 = local_10->ActiveId;
  }
  else {
    IVar3 = local_10->CaptureKeyboardNextFrame;
  }
  local_12d = IVar3 != 0;
  (local_10->IO).WantCaptureKeyboard = local_12d;
  local_12e = false;
  if (local_10->ActiveId != 0) {
    local_12e = (local_10->InputTextState).Id == local_10->ActiveId;
  }
  (local_10->IO).WantTextInput = local_12e;
  local_10->MouseCursor = 0;
  local_10->CaptureKeyboardNextFrame = -1;
  local_10->CaptureMouseNextFrame = -1;
  ImVec2::ImVec2((ImVec2 *)&window_1,1.0,1.0);
  local_10->OsImePosRequest = (ImVec2)window_1;
  if ((local_85 & 1) == 0) {
    local_10->HoveredRootWindow = (ImGuiWindow *)0x0;
    local_10->HoveredWindow = (ImGuiWindow *)0x0;
  }
  if ((local_10->HoveredWindow != (ImGuiWindow *)0x0) &&
     (((fVar8 = (local_10->IO).MouseWheel, fVar8 != 0.0 || (NAN(fVar8))) &&
      ((local_10->HoveredWindow->Collapsed & 1U) == 0)))) {
    this = local_10->HoveredWindow;
    if (((local_10->IO).KeyCtrl & 1U) == 0) {
      if ((this->Flags & 0x10U) == 0) {
        window_2._4_4_ = 5;
        if ((this->Flags & 0x800000U) != 0) {
          window_2._4_4_ = 3;
        }
        fVar8 = (this->Scroll).y;
        fVar9 = (local_10->IO).MouseWheel;
        fVar10 = ImGuiWindow::CalcFontSize(this);
        SetWindowScrollY(this,-(fVar9 * fVar10) * (float)window_2._4_4_ + fVar8);
      }
    }
    else if (((local_10->IO).FontAllowUserScaling & 1U) != 0) {
      offset.y = ImClamp((local_10->IO).MouseWheel * 0.1 + this->FontWindowScale,0.5,2.5);
      offset.x = offset.y / this->FontWindowScale;
      this->FontWindowScale = offset.y;
      local_b8 = operator*(&this->Size,1.0 - offset.x);
      _i_3 = operator-(&(local_10->IO).MousePos,&this->Pos);
      local_b0 = operator*(&local_b8,(ImVec2 *)&i_3);
      local_a8 = operator/(&local_b0,&this->Size);
      operator+=(&this->Pos,&local_a8);
      operator+=(&this->PosFloat,&local_a8);
      operator*=(&this->Size,offset.x);
      operator*=(&this->SizeFull,offset.x);
    }
  }
  if (((local_10->ActiveId == 0) && (local_10->FocusedWindow != (ImGuiWindow *)0x0)) &&
     (((local_10->FocusedWindow->Active & 1U) != 0 && (bVar4 = IsKeyPressedMap(0,false), bVar4)))) {
    local_10->FocusedWindow->FocusIdxTabRequestNext = 0;
  }
  for (window_2._0_4_ = 0; (int)window_2 != (local_10->Windows).Size;
      window_2._0_4_ = (int)window_2 + 1) {
    ppIVar7 = ImVector<ImGuiWindow_*>::operator[](&local_10->Windows,(int)window_2);
    pIStack_d0 = *ppIVar7;
    pIStack_d0->WasActive = (bool)(pIStack_d0->Active & 1);
    pIStack_d0->Active = false;
    pIStack_d0->Accessed = false;
  }
  if ((local_10->FocusedWindow != (ImGuiWindow *)0x0) &&
     ((local_10->FocusedWindow->WasActive & 1U) == 0)) {
    local_d4 = (local_10->Windows).Size;
    do {
      local_d4 = local_d4 + -1;
      if (local_d4 < 0) goto LAB_0012f538;
      ppIVar7 = ImVector<ImGuiWindow_*>::operator[](&local_10->Windows,local_d4);
    } while ((((*ppIVar7)->WasActive & 1U) == 0) ||
            (ppIVar7 = ImVector<ImGuiWindow_*>::operator[](&local_10->Windows,local_d4),
            ((*ppIVar7)->Flags & 0x100000U) != 0));
    ppIVar7 = ImVector<ImGuiWindow_*>::operator[](&local_10->Windows,local_d4);
    FocusWindow(*ppIVar7);
  }
LAB_0012f538:
  ImVector<ImGuiWindow_*>::resize(&local_10->CurrentWindowStack,0);
  ImVector<ImGuiPopupRef>::resize(&local_10->CurrentPopupStack,0);
  CloseInactivePopups();
  ImVec2::ImVec2(&local_dc,400.0,400.0);
  SetNextWindowSize(&local_dc,4);
  Begin("Debug",(bool *)0x0,0);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    ImGuiContext& g = *GImGui;

    // Check user data
    IM_ASSERT(g.IO.DeltaTime >= 0.0f);               // Need a positive DeltaTime (zero is tolerated but will cause some timing issues)
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f);
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0);           // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded());     // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f);  // Invalid style setting

    if (!g.Initialized)
    {
        // Initialize on first frame
        g.LogClipboard = (ImGuiTextBuffer*)ImGui::MemAlloc(sizeof(ImGuiTextBuffer));
        IM_PLACEMENT_NEW(g.LogClipboard) ImGuiTextBuffer();

        IM_ASSERT(g.Settings.empty());
        LoadSettings();
        g.Initialized = true;
    }

    SetCurrentFont(g.IO.Fonts->Fonts[0]);

    g.Time += g.IO.DeltaTime;
    g.FrameCount += 1;
    g.Tooltip[0] = '\0';
    g.OverlayDrawList.Clear();
    g.OverlayDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.OverlayDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it
    g.RenderDrawData.Valid = false;
    g.RenderDrawData.CmdLists = NULL;
    g.RenderDrawData.CmdListsCount = g.RenderDrawData.TotalVtxCount = g.RenderDrawData.TotalIdxCount = 0;

    // Update inputs state
    if (g.IO.MousePos.x < 0 && g.IO.MousePos.y < 0)
        g.IO.MousePos = ImVec2(-9999.0f, -9999.0f);
    if ((g.IO.MousePos.x < 0 && g.IO.MousePos.y < 0) || (g.IO.MousePosPrev.x < 0 && g.IO.MousePosPrev.y < 0))   // if mouse just appeared or disappeared (negative coordinate) we cancel out movement in MouseDelta
        g.IO.MouseDelta = ImVec2(0.0f, 0.0f);
    else
        g.IO.MouseDelta = g.IO.MousePos - g.IO.MousePosPrev;
    g.IO.MousePosPrev = g.IO.MousePos;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        g.IO.MouseClicked[i] = g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] < 0.0f;
        g.IO.MouseReleased[i] = !g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] >= 0.0f;
        g.IO.MouseDownDurationPrev[i] = g.IO.MouseDownDuration[i];
        g.IO.MouseDownDuration[i] = g.IO.MouseDown[i] ? (g.IO.MouseDownDuration[i] < 0.0f ? 0.0f : g.IO.MouseDownDuration[i] + g.IO.DeltaTime) : -1.0f;
        g.IO.MouseDoubleClicked[i] = false;
        if (g.IO.MouseClicked[i])
        {
            if (g.Time - g.IO.MouseClickedTime[i] < g.IO.MouseDoubleClickTime)
            {
                if (ImLengthSqr(g.IO.MousePos - g.IO.MouseClickedPos[i]) < g.IO.MouseDoubleClickMaxDist * g.IO.MouseDoubleClickMaxDist)
                    g.IO.MouseDoubleClicked[i] = true;
                g.IO.MouseClickedTime[i] = -FLT_MAX;    // so the third click isn't turned into a double-click
            }
            else
            {
                g.IO.MouseClickedTime[i] = g.Time;
            }
            g.IO.MouseClickedPos[i] = g.IO.MousePos;
            g.IO.MouseDragMaxDistanceSqr[i] = 0.0f;
        }
        else if (g.IO.MouseDown[i])
        {
            g.IO.MouseDragMaxDistanceSqr[i] = ImMax(g.IO.MouseDragMaxDistanceSqr[i], ImLengthSqr(g.IO.MousePos - g.IO.MouseClickedPos[i]));
        }
    }
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = 1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame));

    // Clear reference to active widget if the widget isn't alive anymore
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (!g.ActiveIdIsAlive && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        SetActiveID(0);
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdIsAlive = false;
    g.ActiveIdIsJustActivated = false;

    // Handle user moving window (at the beginning of the frame to avoid input lag or sheering). Only valid for root windows.
    if (g.MovedWindowMoveId && g.MovedWindowMoveId == g.ActiveId)
    {
        KeepAliveID(g.MovedWindowMoveId);
        IM_ASSERT(g.MovedWindow && g.MovedWindow->RootWindow);
        IM_ASSERT(g.MovedWindow->RootWindow->MoveId == g.MovedWindowMoveId);
        if (g.IO.MouseDown[0])
        {
            if (!(g.MovedWindow->Flags & ImGuiWindowFlags_NoMove))
            {
                g.MovedWindow->PosFloat += g.IO.MouseDelta;
                if (!(g.MovedWindow->Flags & ImGuiWindowFlags_NoSavedSettings))
                    MarkSettingsDirty();
            }
            FocusWindow(g.MovedWindow);
        }
        else
        {
            SetActiveID(0);
            g.MovedWindow = NULL;
            g.MovedWindowMoveId = 0;
        }
    }
    else
    {
        g.MovedWindow = NULL;
        g.MovedWindowMoveId = 0;
    }

    // Delay saving settings so we don't spam disk too much
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
            SaveSettings();
    }

    // Find the window we are hovering. Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow
    g.HoveredWindow = g.MovedWindow ? g.MovedWindow : FindHoveredWindow(g.IO.MousePos, false);
    if (g.HoveredWindow && (g.HoveredWindow->Flags & ImGuiWindowFlags_ChildWindow))
        g.HoveredRootWindow = g.HoveredWindow->RootWindow;
    else
        g.HoveredRootWindow = g.MovedWindow ? g.MovedWindow->RootWindow : FindHoveredWindow(g.IO.MousePos, true);

    if (ImGuiWindow* modal_window = GetFrontMostModalRootWindow())
    {
        g.ModalWindowDarkeningRatio = ImMin(g.ModalWindowDarkeningRatio + g.IO.DeltaTime * 6.0f, 1.0f);
        ImGuiWindow* window = g.HoveredRootWindow;
        while (window && window != modal_window)
            window = window->ParentWindow;
        if (!window)
            g.HoveredRootWindow = g.HoveredWindow = NULL;
    }
    else
    {
        g.ModalWindowDarkeningRatio = 0.0f;
    }

    // Are we using inputs? Tell user so they can capture/discard the inputs away from the rest of their application.
    // When clicking outside of a window we assume the click is owned by the application and won't request capture. We need to track click ownership.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[mouse_earliest_button_down] > g.IO.MouseClickedTime[i])
                mouse_earliest_button_down = i;
    }
    bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];
    if (g.CaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.CaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.ActiveId != 0) || (!g.OpenPopupStack.empty());
    g.IO.WantCaptureKeyboard = (g.CaptureKeyboardNextFrame != -1) ? (g.CaptureKeyboardNextFrame != 0) : (g.ActiveId != 0);
    g.IO.WantTextInput = (g.ActiveId != 0 && g.InputTextState.Id == g.ActiveId);
    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.CaptureMouseNextFrame = g.CaptureKeyboardNextFrame = -1;
    g.OsImePosRequest = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    if (!mouse_avail_to_imgui)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // Scale & Scrolling
    if (g.HoveredWindow && g.IO.MouseWheel != 0.0f && !g.HoveredWindow->Collapsed)
    {
        ImGuiWindow* window = g.HoveredWindow;
        if (g.IO.KeyCtrl)
        {
            if (g.IO.FontAllowUserScaling)
            {
                // Zoom / Scale window
                float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
                float scale = new_font_scale / window->FontWindowScale;
                window->FontWindowScale = new_font_scale;

                const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
                window->Pos += offset;
                window->PosFloat += offset;
                window->Size *= scale;
                window->SizeFull *= scale;
            }
        }
        else if (!(window->Flags & ImGuiWindowFlags_NoScrollWithMouse))
        {
            // Scroll
            const int scroll_lines = (window->Flags & ImGuiWindowFlags_ComboBox) ? 3 : 5;
            SetWindowScrollY(window, window->Scroll.y - g.IO.MouseWheel * window->CalcFontSize() * scroll_lines);
        }
    }

    // Pressing TAB activate widget focus
    // NB: Don't discard FocusedWindow if it isn't active, so that a window that go on/off programatically won't lose its keyboard focus.
    if (g.ActiveId == 0 && g.FocusedWindow != NULL && g.FocusedWindow->Active && IsKeyPressedMap(ImGuiKey_Tab, false))
        g.FocusedWindow->FocusIdxTabRequestNext = 0;

    // Mark all windows as not visible
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->Accessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.FocusedWindow && !g.FocusedWindow->WasActive)
        for (int i = g.Windows.Size-1; i >= 0; i--)
            if (g.Windows[i]->WasActive && !(g.Windows[i]->Flags & ImGuiWindowFlags_ChildWindow))
            {
                FocusWindow(g.Windows[i]);
                break;
            }

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.CurrentPopupStack.resize(0);
    CloseInactivePopups();

    // Create implicit window - we will only render it if the user has added something to it.
    ImGui::SetNextWindowSize(ImVec2(400,400), ImGuiSetCond_FirstUseEver);
    ImGui::Begin("Debug");
}